

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftinit.c
# Opt level: O0

FT_Error FT_Done_FreeType(FT_Library library)

{
  FT_Memory memory_00;
  FT_Memory memory;
  FT_Library library_local;
  
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else {
    memory_00 = library->memory;
    FT_Done_Library(library);
    FT_Done_Memory(memory_00);
    library_local._4_4_ = 0;
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Done_FreeType( FT_Library  library )
  {
    FT_Memory  memory;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    memory = library->memory;

    /* Discard the library object */
    FT_Done_Library( library );

    /* discard memory manager */
    FT_Done_Memory( memory );

    return FT_Err_Ok;
  }